

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O3

bool __thiscall
Rml::FontProvider::AddFace
          (FontProvider *this,FontFaceHandleFreetype face,String *family,FontStyle style,
          FontWeight weight,bool fallback_face,UniquePtr<byte[]> *face_memory)

{
  pointer *pppFVar1;
  pointer pcVar2;
  iterator __position;
  size_t sVar3;
  Node *pNVar4;
  _Head_base<0UL,_Rml::FontFamily_*,_false> this_00;
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *this_01;
  FontFace *pFVar5;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  _Var6;
  undefined6 in_register_00000082;
  pointer __p;
  bool bVar7;
  FontFace *font_face_result;
  String family_lower;
  _Head_base<0UL,_Rml::FontFamily_*,_false> local_88;
  _Head_base<0UL,_unsigned_char_*,_false> local_80;
  FontFaceHandleFreetype local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  String local_50;
  
  if ((int)CONCAT62(in_register_00000082,weight) == 0 || family->_M_string_length == 0) {
    bVar7 = false;
  }
  else {
    pcVar2 = (family->_M_dataplus)._M_p;
    local_78 = face;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + family->_M_string_length);
    StringUtilities::ToLower(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar3 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)this,&local_70);
    pNVar4 = (this->font_families).mKeyVals + sVar3;
    if (pNVar4 == (Node *)(this->font_families).mInfo) {
      this_00._M_head_impl = (FontFamily *)operator_new(0x38);
      FontFamily::FontFamily(this_00._M_head_impl,&local_70);
      local_88._M_head_impl = this_00._M_head_impl;
      this_01 = (__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::
                doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>>
                          ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                            *)this,&local_70);
      local_88._M_head_impl = (FontFamily *)0x0;
      ::std::__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::reset
                (this_01,this_00._M_head_impl);
      ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)&local_88);
    }
    else {
      this_00._M_head_impl =
           (pNVar4->mData).second._M_t.
           super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
           super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
           super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl;
    }
    local_80._M_head_impl =
         (face_memory->_M_t).
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (face_memory->_M_t).super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    pFVar5 = FontFamily::AddFace(this_00._M_head_impl,local_78,style,weight,
                                 (UniquePtr<byte[]> *)&local_80);
    if (local_80._M_head_impl != (uchar *)0x0) {
      operator_delete__(local_80._M_head_impl);
    }
    local_80._M_head_impl = (uchar *)0x0;
    local_88._M_head_impl = (FontFamily *)pFVar5;
    if (fallback_face && pFVar5 != (FontFace *)0x0) {
      _Var6 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<Rml::FontFace**,std::vector<Rml::FontFace*,std::allocator<Rml::FontFace*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::FontFace*const>>
                        ((this->fallback_font_faces).
                         super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (this->fallback_font_faces).
                         super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_88);
      __position._M_current =
           (this->fallback_font_faces).
           super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (_Var6._M_current == __position._M_current) {
        if (_Var6._M_current ==
            (this->fallback_font_faces).
            super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<Rml::FontFace*,std::allocator<Rml::FontFace*>>::
          _M_realloc_insert<Rml::FontFace*const&>
                    ((vector<Rml::FontFace*,std::allocator<Rml::FontFace*>> *)
                     &this->fallback_font_faces,__position,(FontFace **)&local_88);
        }
        else {
          *__position._M_current = (FontFace *)local_88._M_head_impl;
          pppFVar1 = &(this->fallback_font_faces).
                      super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
    }
    bVar7 = (FontFace *)local_88._M_head_impl != (FontFace *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar7;
}

Assistant:

bool FontProvider::AddFace(FontFaceHandleFreetype face, const String& family, Style::FontStyle style, Style::FontWeight weight, bool fallback_face,
	UniquePtr<byte[]> face_memory)
{
	if (family.empty() || weight == Style::FontWeight::Auto)
		return false;

	String family_lower = StringUtilities::ToLower(family);
	FontFamily* font_family = nullptr;
	auto it = font_families.find(family_lower);
	if (it != font_families.end())
	{
		font_family = (FontFamily*)it->second.get();
	}
	else
	{
		auto font_family_ptr = MakeUnique<FontFamily>(family_lower);
		font_family = font_family_ptr.get();
		font_families[family_lower] = std::move(font_family_ptr);
	}

	FontFace* font_face_result = font_family->AddFace(face, style, weight, std::move(face_memory));

	if (font_face_result && fallback_face)
	{
		auto it_fallback_face = std::find(fallback_font_faces.begin(), fallback_font_faces.end(), font_face_result);
		if (it_fallback_face == fallback_font_faces.end())
		{
			fallback_font_faces.push_back(font_face_result);
		}
	}

	return static_cast<bool>(font_face_result);
}